

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

void __thiscall t_go_generator::generate_service(t_go_generator *this,t_service *tservice)

{
  string local_b0 [8];
  string f_service_name;
  undefined1 local_70 [8];
  string filename;
  allocator local_39;
  string local_38 [8];
  string test_suffix;
  t_service *tservice_local;
  t_go_generator *this_local;
  
  test_suffix.field_2._8_8_ = tservice;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"_test",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::string
            ((string *)(f_service_name.field_2._M_local_buf + 8),
             (string *)&(this->super_t_generator).service_name_);
  t_generator::lowercase((string *)local_70,(string *)((long)&f_service_name.field_2 + 8));
  std::__cxx11::string::~string((string *)(f_service_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_b0);
  generate_service_interface(this,(t_service *)test_suffix.field_2._8_8_);
  generate_service_client(this,(t_service *)test_suffix.field_2._8_8_);
  generate_service_server(this,(t_service *)test_suffix.field_2._8_8_);
  generate_service_helpers(this,(t_service *)test_suffix.field_2._8_8_);
  generate_service_remote(this,(t_service *)test_suffix.field_2._8_8_);
  std::operator<<((ostream *)&this->f_types_,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void t_go_generator::generate_service(t_service* tservice) {
  string test_suffix("_test");
  string filename = lowercase(service_name_);
  string f_service_name;

  generate_service_interface(tservice);
  generate_service_client(tservice);
  generate_service_server(tservice);
  generate_service_helpers(tservice);
  generate_service_remote(tservice);
  f_types_ << endl;
}